

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  char_t *pcVar3;
  xml_node *this_00;
  long lVar4;
  long lVar5;
  char_t *pcVar6;
  char_t *path__00;
  xml_node_struct *pxVar7;
  xml_node subsearch;
  xml_node local_50;
  xml_node local_48;
  int local_3c;
  xml_node local_38;
  
  if (*path_ == delimiter) {
    pxVar7 = this->_root;
    if (pxVar7 == (xml_node_struct *)0x0) {
      xml_node(&local_48);
    }
    else {
      xml_node(&local_48,
               (xml_node_struct *)(*(long *)((long)pxVar7 - (pxVar7->header >> 8)) + -0x40));
    }
  }
  else {
    local_48 = (xml_node)this->_root;
  }
  if (local_48._root == (xml_node_struct *)0x0) {
LAB_006f5edb:
    xml_node(&local_50);
  }
  else {
    pcVar6 = path_ + -3;
    do {
      pcVar3 = pcVar6;
      cVar2 = pcVar3[3];
      pcVar6 = pcVar3 + 1;
    } while (cVar2 == delimiter);
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      lVar5 = lVar4 + 1;
      if (pcVar3[lVar4 + 3] == '\0') break;
    } while (pcVar3[lVar4 + 3] != delimiter);
    if (lVar5 == 1) {
      return (xml_node)local_48._root;
    }
    pcVar6 = pcVar3 + 1 + lVar5;
    do {
      path__00 = pcVar6 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = path__00;
    } while (*pcVar1 == delimiter);
    if (lVar5 == 2 && cVar2 == '.') {
      this_00 = &local_48;
    }
    else {
      if (((cVar2 != '.') || (lVar5 != 3)) || (pcVar3[4] != '.')) {
        pxVar7 = (local_48._root)->first_child;
        if (pxVar7 != (xml_node_struct *)0x0) {
          local_3c = (int)delimiter;
          do {
            pcVar6 = pxVar7->name;
            if (pcVar6 != (char_t *)0x0) {
              lVar5 = 0;
              do {
                if (pcVar6[lVar5] != pcVar3[lVar5 + 3]) goto LAB_006f5ed2;
                lVar5 = lVar5 + 1;
              } while (lVar4 != lVar5);
              if (pcVar6[lVar4] == '\0') {
                xml_node(&local_38,pxVar7);
                local_50 = first_element_by_path(&local_38,path__00,(char_t)local_3c);
                if (local_50._root != (xml_node_struct *)0x0) {
                  return (xml_node)local_50._root;
                }
              }
            }
LAB_006f5ed2:
            pxVar7 = pxVar7->next_sibling;
          } while (pxVar7 != (xml_node_struct *)0x0);
        }
        goto LAB_006f5edb;
      }
      this_00 = &local_38;
      xml_node(this_00,(local_48._root)->parent);
    }
    local_50 = first_element_by_path(this_00,path__00,delimiter);
  }
  return (xml_node)local_50._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				const char_t* jname = j->name;
				if (jname && impl::strequalrange(jname, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}